

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

ExprPtr __thiscall pegmatite::regex(pegmatite *this,wchar_t *s)

{
  RegexExpr<wchar_t> *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ExprPtr EVar1;
  wchar_t *s_local;
  
  this_00 = (RegexExpr<wchar_t> *)operator_new(0x28);
  anon_unknown.dwarf_50a29::RegexExpr<wchar_t>::RegexExpr(this_00,s);
  ExprPtr::ExprPtr((ExprPtr *)this,(Expr *)this_00);
  EVar1.super_shared_ptr<pegmatite::Expr>.
  super___shared_ptr<pegmatite::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  EVar1.super_shared_ptr<pegmatite::Expr>.
  super___shared_ptr<pegmatite::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (ExprPtr)EVar1.super_shared_ptr<pegmatite::Expr>.
                  super___shared_ptr<pegmatite::Expr,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ExprPtr regex(const wchar_t *s)
{
	return ExprPtr(new RegexExpr<wchar_t>(s));
}